

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O2

Ref<embree::XML> __thiscall
embree::parseXML(embree *this,Ref<embree::Stream<embree::Token>_> *cin,size_t depth)

{
  bool bVar1;
  XML *this_00;
  Token *pTVar2;
  runtime_error *prVar3;
  long *local_280 [9];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_238;
  Token local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  XML *local_1e0;
  size_t local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1e0 = (XML *)this;
  local_1d8 = depth;
  if (0x400 < depth) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    pTVar2 = Stream<embree::Token>::peek(cin->ptr);
    ParseLocation::str_abi_cxx11_((string *)&local_230,&pTVar2->loc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230,
                   ": maximal nesting depth reached");
    std::runtime_error::runtime_error(prVar3,(string *)local_280);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (XML *)::operator_new(0xb0);
  std::__cxx11::string::string((string *)local_280,"",(allocator *)&local_230);
  XML::XML(this_00,(string *)local_280);
  (local_1e0->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_RefCount)._vptr_RefCount[2])(this_00);
  std::__cxx11::string::~string((string *)local_280);
  pTVar2 = Stream<embree::Token>::peek(cin->ptr);
  ParseLocation::operator=(&this_00->loc,&pTVar2->loc);
  Stream<embree::Token>::get((Token *)local_280,cin->ptr);
  std::__cxx11::string::string((string *)&local_f0,"<",(allocator *)&local_1d0);
  Token::Sym(&local_230,&local_f0);
  bVar1 = operator!=((Token *)local_280,&local_230);
  Token::~Token(&local_230);
  std::__cxx11::string::~string((string *)&local_f0);
  Token::~Token((Token *)local_280);
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    pTVar2 = Stream<embree::Token>::unget(cin->ptr,1);
    ParseLocation::str_abi_cxx11_((string *)&local_230,&pTVar2->loc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230,
                   ": tag expected");
    std::runtime_error::runtime_error(prVar3,(string *)local_280);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Stream<embree::Token>::get((Token *)local_280,cin->ptr);
  Token::Identifier_abi_cxx11_((string *)&local_230,(Token *)local_280);
  local_1e8 = &this_00->name;
  std::__cxx11::string::operator=((string *)local_1e8,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  Token::~Token((Token *)local_280);
  parseComments(cin);
  local_238 = &this_00->parms;
  while( true ) {
    pTVar2 = Stream<embree::Token>::peek(cin->ptr);
    std::__cxx11::string::string((string *)&local_b0,"/>",(allocator *)&local_1d0);
    Token::Sym((Token *)local_280,&local_b0);
    bVar1 = operator!=(pTVar2,(Token *)local_280);
    if (!bVar1) break;
    pTVar2 = Stream<embree::Token>::peek(cin->ptr);
    std::__cxx11::string::string((string *)&local_50,">",(allocator *)&local_1b0);
    Token::Sym(&local_230,&local_50);
    bVar1 = operator!=(pTVar2,&local_230);
    Token::~Token(&local_230);
    std::__cxx11::string::~string((string *)&local_50);
    Token::~Token((Token *)local_280);
    std::__cxx11::string::~string((string *)&local_b0);
    if (!bVar1) goto LAB_00194a3c;
    parseParm(cin,local_238);
    parseComments(cin);
  }
  Token::~Token((Token *)local_280);
  std::__cxx11::string::~string((string *)&local_b0);
LAB_00194a3c:
  pTVar2 = Stream<embree::Token>::peek(cin->ptr);
  std::__cxx11::string::string((string *)&local_110,"/>",(allocator *)&local_230);
  Token::Sym((Token *)local_280,&local_110);
  bVar1 = operator==(pTVar2,(Token *)local_280);
  Token::~Token((Token *)local_280);
  std::__cxx11::string::~string((string *)&local_110);
  if (bVar1) {
    Stream<embree::Token>::drop(cin->ptr);
  }
  else {
    Stream<embree::Token>::drop(cin->ptr);
    parseComments(cin);
    local_238 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&this_00->body;
    while( true ) {
      pTVar2 = Stream<embree::Token>::peek(cin->ptr);
      std::__cxx11::string::string((string *)&local_d0,"<",(allocator *)&local_1d0);
      Token::Sym((Token *)local_280,&local_d0);
      bVar1 = operator!=(pTVar2,(Token *)local_280);
      if (!bVar1) break;
      pTVar2 = Stream<embree::Token>::peek(cin->ptr);
      std::__cxx11::string::string((string *)&local_70,"</",(allocator *)&local_1b0);
      Token::Sym(&local_230,&local_70);
      bVar1 = operator!=(pTVar2,&local_230);
      Token::~Token(&local_230);
      std::__cxx11::string::~string((string *)&local_70);
      Token::~Token((Token *)local_280);
      std::__cxx11::string::~string((string *)&local_d0);
      if (!bVar1) goto LAB_00194bc3;
      Stream<embree::Token>::get((Token *)local_280,cin->ptr);
      std::vector<embree::Token,_std::allocator<embree::Token>_>::emplace_back<embree::Token>
                ((vector<embree::Token,_std::allocator<embree::Token>_> *)local_238,
                 (Token *)local_280);
      Token::~Token((Token *)local_280);
      parseComments(cin);
    }
    Token::~Token((Token *)local_280);
    std::__cxx11::string::~string((string *)&local_d0);
LAB_00194bc3:
    pTVar2 = Stream<embree::Token>::peek(cin->ptr);
    std::__cxx11::string::string((string *)&local_130,"<",(allocator *)&local_230);
    Token::Sym((Token *)local_280,&local_130);
    bVar1 = operator==(pTVar2,(Token *)local_280);
    Token::~Token((Token *)local_280);
    std::__cxx11::string::~string((string *)&local_130);
    if (bVar1) {
      local_1d8 = local_1d8 + 1;
      while( true ) {
        pTVar2 = Stream<embree::Token>::peek(cin->ptr);
        std::__cxx11::string::string((string *)&local_90,"</",(allocator *)&local_230);
        Token::Sym((Token *)local_280,&local_90);
        bVar1 = operator!=(pTVar2,(Token *)local_280);
        Token::~Token((Token *)local_280);
        std::__cxx11::string::~string((string *)&local_90);
        if (!bVar1) break;
        parseXML((embree *)local_280,cin,local_1d8);
        std::vector<embree::Ref<embree::XML>,std::allocator<embree::Ref<embree::XML>>>::
        emplace_back<embree::Ref<embree::XML>>
                  ((vector<embree::Ref<embree::XML>,std::allocator<embree::Ref<embree::XML>>> *)
                   &this_00->children,(Ref<embree::XML> *)local_280);
        if (local_280[0] != (long *)0x0) {
          (**(code **)(*local_280[0] + 0x18))();
        }
        parseComments(cin);
      }
    }
    Stream<embree::Token>::get((Token *)local_280,cin->ptr);
    std::__cxx11::string::string((string *)&local_150,"</",(allocator *)&local_1d0);
    Token::Sym(&local_230,&local_150);
    bVar1 = operator!=((Token *)local_280,&local_230);
    Token::~Token(&local_230);
    std::__cxx11::string::~string((string *)&local_150);
    Token::~Token((Token *)local_280);
    if (bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar2 = Stream<embree::Token>::unget(cin->ptr,1);
      ParseLocation::str_abi_cxx11_((string *)&local_230,&pTVar2->loc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230
                     ,": symbol \"</\" expected");
      std::runtime_error::runtime_error(prVar3,(string *)local_280);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Stream<embree::Token>::get((Token *)local_280,cin->ptr);
    std::__cxx11::string::string((string *)&local_170,(string *)local_1e8);
    Token::Id(&local_230,&local_170);
    bVar1 = operator!=((Token *)local_280,&local_230);
    Token::~Token(&local_230);
    std::__cxx11::string::~string((string *)&local_170);
    Token::~Token((Token *)local_280);
    if (bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar2 = Stream<embree::Token>::unget(cin->ptr,1);
      ParseLocation::str_abi_cxx11_(&local_1b0,&pTVar2->loc);
      std::operator+(&local_1d0,&local_1b0,": closing ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230
                     ,&local_1d0,local_1e8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230
                     ," expected");
      std::runtime_error::runtime_error(prVar3,(string *)local_280);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Stream<embree::Token>::get((Token *)local_280,cin->ptr);
    std::__cxx11::string::string((string *)&local_190,">",(allocator *)&local_1d0);
    Token::Sym(&local_230,&local_190);
    bVar1 = operator!=((Token *)local_280,&local_230);
    Token::~Token(&local_230);
    std::__cxx11::string::~string((string *)&local_190);
    Token::~Token((Token *)local_280);
    if (bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar2 = Stream<embree::Token>::unget(cin->ptr,1);
      ParseLocation::str_abi_cxx11_((string *)&local_230,&pTVar2->loc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230
                     ,": symbol \">\" expected");
      std::runtime_error::runtime_error(prVar3,(string *)local_280);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return (Ref<embree::XML>)local_1e0;
}

Assistant:

Ref<XML> parseXML(Ref<Stream<Token> >& cin, size_t depth)
  {
    if (depth > 1024)
      THROW_RUNTIME_ERROR(cin->peek().Location().str()+": maximal nesting depth reached");
      
    Ref<XML> xml = new XML;
    xml->loc = cin->peek().Location();

    /* parse tag opening */
    if (cin->get() != Token::Sym("<")) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": tag expected");

    xml->name = cin->get().Identifier();
    parseComments(cin);
    while (cin->peek() != Token::Sym("/>") && cin->peek() != Token::Sym(">")) {
      parseParm(cin,xml->parms);
      parseComments(cin);
    }
    if (cin->peek() == Token::Sym("/>")) {
      cin->drop();
      return xml;
    }
    cin->drop();

    /* parse body token list */
    parseComments(cin);
    while (cin->peek() != Token::Sym("<") && cin->peek() != Token::Sym("</")) {
      xml->body.push_back(cin->get());
      parseComments(cin);
    }

    /* the body also contains children */
    if (cin->peek() == Token::Sym("<")) {
      while (cin->peek() != Token::Sym("</")) {
        xml->children.push_back(parseXML(cin,depth+1));
        parseComments(cin);
      }
    }

    /* parse tag closing */
    if (cin->get() != Token::Sym("</")    ) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": symbol \"</\" expected");
    if (cin->get() != Token::Id(xml->name)) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": closing "+xml->name+" expected");
    if (cin->get() != Token::Sym(">")     ) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": symbol \">\" expected");

    return xml;
  }